

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall restincurl::RequestBuilder::Header(RequestBuilder *this,char *value)

{
  pointer pRVar1;
  headers_t *ppcVar2;
  headers_t pcVar3;
  char *value_local;
  RequestBuilder *this_local;
  
  if (value == (char *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x4d6,"RequestBuilder &restincurl::RequestBuilder::Header(const char *)");
  }
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x4d7,"RequestBuilder &restincurl::RequestBuilder::Header(const char *)");
  }
  pRVar1 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
           operator->(&this->request_);
  ppcVar2 = Request::GetHeaders(pRVar1);
  pcVar3 = (headers_t)curl_slist_append(*ppcVar2,value);
  pRVar1 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
           operator->(&this->request_);
  ppcVar2 = Request::GetHeaders(pRVar1);
  *ppcVar2 = pcVar3;
  return this;
}

Assistant:

RequestBuilder& Header(const char *value) {
            assert(value);
            assert(!is_built_);
            request_->GetHeaders() = curl_slist_append(request_->GetHeaders(), value);
            return *this;
        }